

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_truncated_filter.c
# Opt level: O1

void test_truncation(char *compression,_func_int_archive_ptr *set_compression,int can_prog)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  void *__ptr;
  void *__s;
  archive *paVar4;
  ssize_t sVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  longlong v1;
  long lVar9;
  archive_entry *ae;
  size_t used1;
  char path [16];
  archive_entry *local_68;
  void *local_60;
  char *local_58;
  ulong local_50;
  char local_48 [24];
  
  local_58 = compression;
  __ptr = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                   ,L'/',(uint)(__ptr != (void *)0x0),"NULL != (buff = (char *)malloc(buffsize))",
                   (void *)0x0);
  if (__ptr != (void *)0x0) {
    __s = malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                     ,L'4',(uint)(__s != (void *)0x0),"NULL != (data = (char *)malloc(datasize))",
                     (void *)0x0);
    if (__s != (void *)0x0) {
      local_60 = __ptr;
      memset(__s,0,10000);
      paVar4 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'>',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar4);
      wVar2 = archive_write_add_filter_compress(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'A',0,"ARCHIVE_OK",(long)wVar2,"archive_write_add_filter_compress(a)",
                          paVar4);
      iVar1 = (*set_compression)(paVar4);
      if (can_prog == 0 && iVar1 != 0) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'D');
        test_skipping("%s writing not supported on this platform",local_58);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        __ptr = __s;
        __s = local_60;
      }
      else {
        iVar3 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'M',0,"ARCHIVE_OK",(long)iVar3,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar3 = archive_write_open_memory(paVar4,local_60,2000000,&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'O',0,"ARCHIVE_OK",(long)iVar3,
                            "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
        local_68 = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                         ,L'P',(uint)(local_68 != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype(local_68,0x8000);
        archive_entry_set_size(local_68,10000);
        uVar8 = 0;
        do {
          sprintf(local_48,"%s%d",local_58,uVar8);
          archive_entry_copy_pathname(local_68,local_48);
          failure(local_48);
          iVar3 = archive_write_header(paVar4,local_68);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                                      ,L'X',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)"
                                      ,paVar4);
          if (wVar2 == L'\0') {
LAB_001a2258:
            archive_write_free(paVar4);
            __ptr = local_60;
            goto LAB_001a232a;
          }
          lVar9 = 0;
          do {
            iVar3 = rand();
            *(char *)((long)__s + lVar9) = (char)iVar3;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 10000);
          failure(local_48);
          sVar5 = archive_write_data(paVar4,__s,10000);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                                      ,L'c',10000,"datasize",sVar5,
                                      "archive_write_data(a, data, datasize)",paVar4);
          if (wVar2 == L'\0') goto LAB_001a2258;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar7 != 100);
        archive_entry_free(local_68);
        iVar3 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'k',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar4);
        iVar3 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'l',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                         ,L'n',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar3 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'o',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",
                            paVar4);
        iVar3 = archive_read_support_filter_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'p',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",
                            paVar4);
        iVar3 = archive_read_open_memory(paVar4,local_60,local_50 - (local_50 >> 6));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L's',0,"ARCHIVE_OK",(long)iVar3,
                            "archive_read_open_memory(a, buff, used1 - used1/64)",paVar4);
        uVar8 = 0;
        do {
          iVar3 = archive_read_next_header(paVar4,&local_68);
          if (iVar3 != 0) {
            wVar2 = L'x';
LAB_001a2271:
            failure("Should have non-NULL error message for %s",local_58);
            pcVar6 = archive_error_string(paVar4);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                             ,wVar2,(uint)(pcVar6 != (char *)0x0),"NULL != archive_error_string(a)",
                             (void *)0x0);
            break;
          }
          sprintf(local_48,"%s%d",local_58,uVar8);
          pcVar6 = archive_entry_pathname(local_68);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                     ,L'|',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          sVar5 = archive_read_data(paVar4,__s,10000);
          if (sVar5 != 10000) {
            wVar2 = L'\x80';
            goto LAB_001a2271;
          }
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar7 != 100);
        v1 = -0x14;
        if (iVar1 != -0x14 || can_prog == 0) {
          v1 = 0;
        }
        iVar1 = archive_read_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'\x85',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar1,
                            "archive_read_close(a)",paVar4);
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        __ptr = local_60;
      }
LAB_001a232a:
      free(__s);
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
test_truncation(const char *compression,
    int (*set_compression)(struct archive *), int can_prog)
{
	struct archive_entry *ae;
	struct archive* a;
	char path[16];
	char *buff, *data;
	size_t buffsize, datasize, used1;
	int i, j, r, use_prog;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a bunch of files with semi-random data.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_compress(a));
	r = (*set_compression)(a);
	if (r != ARCHIVE_OK && !can_prog) {
		skipping("%s writing not supported on this platform",
		    compression);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	use_prog = (r == ARCHIVE_WARN && can_prog);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "%s%d", compression, i);
		archive_entry_copy_pathname(ae, path);
		failure(path);
		if (!assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_header(a, ae))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
		for (j = 0; j < (int)datasize; ++j) {
			data[j] = (char)(rand() % 256);
		}
		failure(path);
		if (!assertEqualIntA(a, datasize,
		    archive_write_data(a, data, datasize))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1 - used1/64));
	for (i = 0; i < 100; i++) {
		if (ARCHIVE_OK != archive_read_next_header(a, &ae)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
		sprintf(path, "%s%d", compression, i);
		assertEqualString(path, archive_entry_pathname(ae));
		if (datasize != (size_t)archive_read_data(a, data, datasize)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
	}
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(data);
	free(buff);
}